

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_api_v2.c
# Opt level: O0

MPP_RET hal_vp8e_init(void *hal,MppEncHalCfg *cfg)

{
  RK_U32 RVar1;
  void *pvVar2;
  RK_U32 hw_flag;
  void *hw_ctx;
  MppClientType type;
  Halvp8eCtx *ctx;
  MppEncHalApi *p_api;
  MppEncHalCfg *cfg_local;
  void *hal_local;
  
  memset(hal,0,0x10);
  mpp_env_get_u32("vp8e_hal_debug",&vp8e_hal_debug,0);
  RVar1 = mpp_get_vcodec_type();
  if ((RVar1 & 0x40000) == 0) {
    if ((RVar1 & 0x20000) == 0) {
      _mpp_log_l(2,"hal_vp8e_api_v2","Failed to init due to unsupported hard mode, hw_flag = %d\n",
                 "hal_vp8e_init",(ulong)RVar1);
      return MPP_ERR_INIT;
    }
    ctx = (Halvp8eCtx *)&hal_vp8e_vepu1;
    hw_ctx._4_4_ = VPU_CLIENT_VEPU1;
  }
  else {
    ctx = (Halvp8eCtx *)&hal_vp8e_vepu2;
    hw_ctx._4_4_ = VPU_CLIENT_VEPU2;
  }
  if ((ctx == (Halvp8eCtx *)0x0) &&
     (_mpp_log_l(2,"hal_vp8e_api_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"p_api",
                 "hal_vp8e_init",0x42), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((hw_ctx._4_4_ == VPU_CLIENT_BUTT) &&
     (_mpp_log_l(2,"hal_vp8e_api_v2","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "type != VPU_CLIENT_BUTT","hal_vp8e_init",0x43), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  pvVar2 = mpp_osal_calloc("hal_vp8e_init",(ulong)*(uint *)((long)&ctx->hw_ctx + 4));
  if (pvVar2 == (void *)0x0) {
    hal_local._4_4_ = MPP_ERR_MALLOC;
  }
  else {
    *(void **)((long)hal + 8) = pvVar2;
    *(Halvp8eCtx **)hal = ctx;
    cfg->type = hw_ctx._4_4_;
    hal_local._4_4_ = (*(code *)ctx[1].hw_ctx)(pvVar2,cfg);
  }
  return hal_local._4_4_;
}

Assistant:

static MPP_RET hal_vp8e_init(void *hal, MppEncHalCfg *cfg)
{
    const MppEncHalApi  *p_api = NULL;
    Halvp8eCtx *ctx = (Halvp8eCtx *)hal;
    MppClientType type = VPU_CLIENT_BUTT;
    void* hw_ctx = NULL;

    memset(ctx, 0, sizeof(Halvp8eCtx));

    mpp_env_get_u32("vp8e_hal_debug", &vp8e_hal_debug, 0);

    {
        RK_U32 hw_flag = mpp_get_vcodec_type();
        if (hw_flag & HAVE_VEPU2) {
            p_api = &hal_vp8e_vepu2;
            type = VPU_CLIENT_VEPU2;
        } else if (hw_flag & HAVE_VEPU1) {
            p_api = &hal_vp8e_vepu1;
            type = VPU_CLIENT_VEPU1;
        } else {
            mpp_err_f("Failed to init due to unsupported hard mode, hw_flag = %d\n", hw_flag);
            return MPP_ERR_INIT;
        }
    }

    mpp_assert(p_api);
    mpp_assert(type != VPU_CLIENT_BUTT);

    hw_ctx = mpp_calloc_size(void, p_api->ctx_size);
    if (NULL == hw_ctx)
        return MPP_ERR_MALLOC;

    ctx->hw_ctx = hw_ctx;
    ctx->api = p_api;
    cfg->type = type;

    return p_api->init(hw_ctx, cfg);
}